

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestRunStats::~TestRunStats(TestRunStats *this)

{
  void *in_RDI;
  
  ~TestRunStats((TestRunStats *)0x128a78);
  operator_delete(in_RDI);
  return;
}

Assistant:

TestRunStats::~TestRunStats() = default;